

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageInputsXrQueryLocalizationMapsML
                   (XrSession session,XrLocalizationMapQueryInfoBaseHeaderML *queryInfo,
                   uint32_t mapCapacityInput,uint32_t *mapCountOutput,XrLocalizationMapML *maps)

{
  ValidateXrHandleResult VVar1;
  XrResult XVar2;
  GenValidUsageXrInstanceInfo *instance_info;
  long lVar3;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar4;
  XrSession_T *in_stack_fffffffffffffd48;
  string local_2b0;
  string local_290;
  XrSession session_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  string local_240;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_220;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_208;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c0;
  ostringstream oss;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _oss = 2;
  session_local = session;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSession_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &objects_info,&session_local,(XrObjectType *)&oss);
  VVar1 = VerifyXrSessionHandle(&session_local);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar4 = HandleInfo<XrSession_T_*>::getWithInstanceInfo(&g_session_info,session_local);
    instance_info = pVar4.second;
    if (queryInfo == (XrLocalizationMapQueryInfoBaseHeaderML *)0x0) {
      if (maps == (XrLocalizationMapML *)0x0 && mapCapacityInput != 0) {
        std::__cxx11::string::string
                  ((string *)&oss,"VUID-xrQueryLocalizationMapsML-maps-parameter",
                   (allocator *)&local_240);
        std::__cxx11::string::string
                  ((string *)&local_2b0,"xrQueryLocalizationMapsML",
                   (allocator *)&stack0xfffffffffffffd4f);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_1f0,&objects_info);
        std::__cxx11::string::string
                  ((string *)&local_290,
                   "Command xrQueryLocalizationMapsML param maps is NULL, but mapCapacityInput is greater than 0"
                   ,(allocator *)&stack0xfffffffffffffd4e);
        CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2b0
                            ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              *)&local_1f0,&local_290);
        std::__cxx11::string::~string((string *)&local_290);
        this = &local_1f0;
      }
      else if (mapCountOutput == (uint32_t *)0x0) {
        std::__cxx11::string::string
                  ((string *)&oss,"VUID-xrQueryLocalizationMapsML-mapCountOutput-parameter",
                   (allocator *)&local_240);
        std::__cxx11::string::string
                  ((string *)&local_2b0,"xrQueryLocalizationMapsML",
                   (allocator *)&stack0xfffffffffffffd4f);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_208,&objects_info);
        std::__cxx11::string::string
                  ((string *)&local_290,
                   "Invalid NULL for uint32_t \"mapCountOutput\" which is not optional and must be non-NULL"
                   ,(allocator *)&stack0xfffffffffffffd4e);
        CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2b0
                            ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              *)&local_208,&local_290);
        std::__cxx11::string::~string((string *)&local_290);
        this = &local_208;
      }
      else {
        XVar2 = XR_SUCCESS;
        if (maps == (XrLocalizationMapML *)0x0) goto LAB_001ed98d;
        lVar3 = (ulong)mapCapacityInput + 1;
        do {
          lVar3 = lVar3 + -1;
          XVar2 = XR_SUCCESS;
          if (lVar3 == 0) goto LAB_001ed98d;
          std::__cxx11::string::string
                    ((string *)&oss,"xrQueryLocalizationMapsML",(allocator *)&local_2b0);
          XVar2 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,true,true,maps);
          maps = maps + 1;
          std::__cxx11::string::~string((string *)&oss);
        } while (XVar2 == XR_SUCCESS);
        std::__cxx11::string::string
                  ((string *)&oss,"VUID-xrQueryLocalizationMapsML-maps-parameter",
                   (allocator *)&local_240);
        std::__cxx11::string::string
                  ((string *)&local_2b0,"xrQueryLocalizationMapsML",
                   (allocator *)&stack0xfffffffffffffd4f);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_220,&objects_info);
        std::__cxx11::string::string
                  ((string *)&local_290,"Command xrQueryLocalizationMapsML param maps is invalid",
                   (allocator *)&stack0xfffffffffffffd4e);
        CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2b0
                            ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              *)&local_220,&local_290);
        std::__cxx11::string::~string((string *)&local_290);
        this = &local_220;
      }
    }
    else {
      std::__cxx11::string::string
                ((string *)&oss,"xrQueryLocalizationMapsML",(allocator *)&local_2b0);
      ValidateXrStruct(instance_info,(string *)&oss,&objects_info,false,false,queryInfo);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::string
                ((string *)&oss,"VUID-xrQueryLocalizationMapsML-queryInfo-parameter",
                 (allocator *)&local_240);
      std::__cxx11::string::string
                ((string *)&local_2b0,"xrQueryLocalizationMapsML",
                 (allocator *)&stack0xfffffffffffffd4f);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1d8,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_290,"Command xrQueryLocalizationMapsML param queryInfo is invalid"
                 ,(allocator *)&stack0xfffffffffffffd4e);
      CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2b0,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1d8,&local_290);
      std::__cxx11::string::~string((string *)&local_290);
      this = &local_1d8;
    }
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(this);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&oss);
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Invalid XrSession handle \"session\" ");
    HandleToHexString<XrSession_T*>(in_stack_fffffffffffffd48);
    std::operator<<((ostream *)&oss,(string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::string
              ((string *)&local_2b0,"VUID-xrQueryLocalizationMapsML-session-parameter",
               (allocator *)&stack0xfffffffffffffd4f);
    std::__cxx11::string::string
              ((string *)&local_290,"xrQueryLocalizationMapsML",
               (allocator *)&stack0xfffffffffffffd4e);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1c0,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_2b0,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_290,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1c0,&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1c0);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    XVar2 = XR_ERROR_HANDLE_INVALID;
  }
LAB_001ed98d:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               );
  return XVar2;
}

Assistant:

XrResult GenValidUsageInputsXrQueryLocalizationMapsML(
XrSession session,
const XrLocalizationMapQueryInfoBaseHeaderML* queryInfo,
uint32_t mapCapacityInput,
uint32_t * mapCountOutput,
XrLocalizationMapML* maps) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(session, XR_OBJECT_TYPE_SESSION);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSessionHandle(&session);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSession handle \"session\" ";
                oss << HandleToHexString(session);
                CoreValidLogMessage(nullptr, "VUID-xrQueryLocalizationMapsML-session-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrQueryLocalizationMapsML",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_session_info.getWithInstanceInfo(session);
        GenValidUsageXrHandleInfo *gen_session_info = info_with_instance.first;
        (void)gen_session_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Validate that the base-structure XrLocalizationMapQueryInfoBaseHeaderML is valid
        if (nullptr != queryInfo) {
            xr_result = ValidateXrStruct(gen_instance_info, "xrQueryLocalizationMapsML",
                                                            objects_info, false, true, queryInfo);
            if (XR_SUCCESS != xr_result) {
                CoreValidLogMessage(gen_instance_info, "VUID-xrQueryLocalizationMapsML-queryInfo-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrQueryLocalizationMapsML",
                                    objects_info,
                                    "Command xrQueryLocalizationMapsML param queryInfo is invalid");
                return xr_result;
            }
        }
        // Optional array must be non-NULL when mapCapacityInput is non-zero
        if (0 != mapCapacityInput && nullptr == maps) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrQueryLocalizationMapsML-maps-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrQueryLocalizationMapsML",
                                objects_info,
                                "Command xrQueryLocalizationMapsML param maps is NULL, but mapCapacityInput is greater than 0");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == mapCountOutput) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrQueryLocalizationMapsML-mapCountOutput-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrQueryLocalizationMapsML", objects_info,
                                "Invalid NULL for uint32_t \"mapCountOutput\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // NOTE: Can't validate "VUID-xrQueryLocalizationMapsML-mapCountOutput-parameter" type
        if (maps) {
            for (uint32_t value_maps_inc = 0; value_maps_inc < mapCapacityInput; ++value_maps_inc) {
                // Validate that the structure XrLocalizationMapML is valid
                xr_result = ValidateXrStruct(gen_instance_info, "xrQueryLocalizationMapsML", objects_info,
                                                                true, true, &maps[value_maps_inc]);
                if (XR_SUCCESS != xr_result) {
                    CoreValidLogMessage(gen_instance_info, "VUID-xrQueryLocalizationMapsML-maps-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrQueryLocalizationMapsML",
                                        objects_info,
                                        "Command xrQueryLocalizationMapsML param maps is invalid");
                    return xr_result;
                }
            }
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}